

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DMovePolyTo::DMovePolyTo(DMovePolyTo *this,int polyNum)

{
  DPolyAction::DPolyAction(&this->super_DPolyAction,polyNum);
  (this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_0084c0b8;
  (this->m_Speedv).X = 0.0;
  (this->m_Speedv).Y = 0.0;
  (this->m_Target).X = 0.0;
  (this->m_Target).Y = 0.0;
  return;
}

Assistant:

DMovePolyTo::DMovePolyTo(int polyNum)
	: Super(polyNum)
{
	m_Speedv = m_Target = { 0,0 };
}